

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void voc_parse_words(char **wrdtxt,int *len,char **wrd2,int *len2)

{
  int iVar1;
  ushort **ppuVar2;
  int *in_RCX;
  long *in_RDX;
  int *in_RSI;
  long *in_RDI;
  bool bVar3;
  
  iVar1 = osrp2((void *)*in_RDI);
  *in_RSI = iVar1 + -2;
  *in_RDI = *in_RDI + 2;
  *in_RDX = *in_RDI;
  *in_RCX = *in_RSI;
  while( true ) {
    bVar3 = false;
    if (*in_RCX != 0) {
      bVar3 = false;
      if (*(byte *)*in_RDX < 0x80) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)(uint)*(byte *)*in_RDX] & 0x2000) != 0;
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (!bVar3) break;
    *in_RDX = *in_RDX + 1;
    *in_RCX = *in_RCX + -1;
  }
  if (*in_RCX == 0) {
    *in_RDX = 0;
  }
  else {
    *in_RSI = *in_RSI - *in_RCX;
    while( true ) {
      bVar3 = false;
      if ((*in_RCX != 0) && (bVar3 = false, *(byte *)*in_RDX < 0x80)) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)(uint)*(byte *)*in_RDX] & 0x2000) != 0;
      }
      if (!bVar3) break;
      *in_RDX = *in_RDX + 1;
      *in_RCX = *in_RCX + -1;
    }
  }
  return;
}

Assistant:

static void voc_parse_words(char **wrdtxt, int *len, char **wrd2, int *len2)
{
    /* get length and pointer to actual text */
    *len = osrp2(*wrdtxt) - 2;
    *wrdtxt += 2;
    
    /* see if there's a second word - look for a space */
    for (*wrd2 = *wrdtxt, *len2 = *len ; *len2 && !vocisspace(**wrd2) ;
         ++*wrd2, --*len2) ;
    if (*len2)
    {
        *len -= *len2;
        while (*len2 && vocisspace(**wrd2)) ++*wrd2, --*len2;
    }
    else
    {
        /* no space ==> no second word */
        *wrd2 = (char *)0;
    }
}